

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EdExplFinder.cpp
# Opt level: O2

void __thiscall EdExplFinder::clean_data_structures(EdExplFinder *this)

{
  _Bvector_base<std::allocator<bool>_> *p_Var1;
  
  p_Var1 = &this->seq1ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>;
  if (p_Var1 != (_Bvector_base<std::allocator<bool>_> *)0x0) {
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(p_Var1);
  }
  operator_delete(p_Var1);
  p_Var1 = &this->seq2ExcludedCharacters->super__Bvector_base<std::allocator<bool>_>;
  if (p_Var1 != (_Bvector_base<std::allocator<bool>_> *)0x0) {
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(p_Var1);
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

void EdExplFinder::clean_data_structures() {
	delete seq1ExcludedCharacters;
	delete seq2ExcludedCharacters;
}